

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O1

void PlayDramObject(uchar key,int mode,char track)

{
  uint uVar1;
  AudioBackend_Sound *sound;
  
  if (audio_backend_initialised) {
    uVar1 = (int)track + 0x96;
    sound = lpSECONDARYBUFFER[uVar1];
    if (sound != (AudioBackend_Sound *)0x0) {
      if (mode == 1) {
        AudioBackend_StopSound(sound);
        AudioBackend_RewindSound(lpSECONDARYBUFFER[uVar1]);
        ChangeDramFrequency(key,track);
        AudioBackend_PlaySound(lpSECONDARYBUFFER[uVar1],false);
        return;
      }
      if (mode == 0) {
        AudioBackend_StopSound(sound);
        AudioBackend_RewindSound(lpSECONDARYBUFFER[uVar1]);
        return;
      }
    }
  }
  return;
}

Assistant:

void PlayDramObject(unsigned char key, int mode, signed char track)
{
	if (!audio_backend_initialised)
		return;

	if (lpSECONDARYBUFFER[150 + track] != NULL)
	{
		switch (mode)
		{
			case 0:	// 停止 (Stop)
				AudioBackend_StopSound(lpSECONDARYBUFFER[150 + track]);
				AudioBackend_RewindSound(lpSECONDARYBUFFER[150 + track]);
				break;

			case 1:	// 再生 (Playback)
				AudioBackend_StopSound(lpSECONDARYBUFFER[150 + track]);
				AudioBackend_RewindSound(lpSECONDARYBUFFER[150 + track]);
				ChangeDramFrequency(key, track);	// 周波数を設定して (Set the frequency)
				AudioBackend_PlaySound(lpSECONDARYBUFFER[150 + track], FALSE);
				break;

			case 2:	// 歩かせ停止 (Stop playback)
				break;

			case -1:
				break;
		}
	}
}